

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmap.cpp
# Opt level: O2

void test3(void)

{
  HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *this;
  LinkedNode *val;
  ostream *poVar1;
  void *local_38;
  int local_2c;
  
  this = TinyGC::
         MakeGarbageCollected<HeapMap<int,LinkedNode,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
                   (tg);
  for (local_2c = 0; local_2c < 10; local_2c = local_2c + 1) {
    local_38 = (void *)0x0;
    val = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int&>(tg,&local_38,&local_2c);
    HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
    ::insert(this,&local_2c,val);
    HeapMap<int,_LinkedNode,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
    ::at(this,&local_2c);
    poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void test3() {
  HeapMap<int, LinkedNode> *p =
      MakeGarbageCollected<HeapMap<int, LinkedNode>>();
  for (int id = 0; id < 10; id++) {
    auto t = MakeGarbageCollected<LinkedNode>(nullptr, id);
    p->insert(id, t);
    // p->erase(id);
    std::cout << p->at(id) << std::endl;
  }
}